

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O1

endpoint * __thiscall
libtorrent::aux::parse_endpoint
          (endpoint *__return_storage_ptr__,aux *this,string_view str,error_code *ec)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  int *piVar5;
  error_code *peVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  unsigned_long uVar10;
  long lVar11;
  size_type __n;
  string_view sVar12;
  error_code eVar13;
  bytes_type bytes;
  anon_enum_32 in_stack_ffffffffffffff78;
  address_v4 in_stack_ffffffffffffff7c;
  char *pcVar14;
  char *pcVar15;
  char acStack_78 [8];
  unsigned_long local_70;
  ulong local_68;
  unsigned_long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  long lStack_50;
  undefined8 local_48;
  long lStack_40;
  ulong __n_00;
  
  peVar6 = (error_code *)str._M_str;
  *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) = 0;
  *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 2;
  sVar12._M_str._0_4_ = in_stack_ffffffffffffff78;
  sVar12._M_len = 0x302b43;
  sVar12._M_str._4_4_ = in_stack_ffffffffffffff7c.addr_.s_addr;
  sVar12 = trim(sVar12);
  pcVar9 = sVar12._M_str;
  __n_00 = sVar12._M_len;
  if (__n_00 == 0) {
    eVar13 = errors::make_error_code(invalid_port);
  }
  else {
    if (*pcVar9 == '[') {
      pvVar3 = memchr(pcVar9,0x5d,__n_00);
      uVar4 = (long)pvVar3 - (long)pcVar9;
      if (uVar4 == 0xffffffffffffffff || pvVar3 == (void *)0x0) {
        eVar13 = errors::make_error_code(expected_close_bracket_in_address);
        goto LAB_00302dd2;
      }
      uVar7 = uVar4 - 1;
      if (__n_00 - 1 < uVar4 - 1) {
        uVar7 = __n_00 - 1;
      }
      uVar8 = uVar4 + 1;
      if (__n_00 <= uVar4) {
LAB_00302e6d:
        ::std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar8,__n_00);
      }
      uVar4 = __n_00 - uVar8;
      if ((uVar4 == 0) || (pcVar9[uVar8] != ':')) {
        eVar13 = errors::make_error_code(invalid_port);
        goto LAB_00302dd2;
      }
      if (__n_00 == uVar8) {
        uVar8 = 1;
        __n_00 = uVar4;
        goto LAB_00302e6d;
      }
      pcVar14 = acStack_78;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff78,pcVar9 + 1,pcVar9 + 1 + uVar7);
      local_60 = 0;
      iVar1 = boost::asio::detail::socket_ops::inet_pton(10,pcVar14,&local_58);
      if (iVar1 < 1) {
        local_48 = 0;
        lStack_40 = 0;
        uVar10 = 0;
      }
      else {
        local_48 = CONCAT44(uStack_54,local_58);
        lStack_40 = lStack_50;
        uVar10 = local_60;
      }
      if (pcVar14 != acStack_78) {
        operator_delete(pcVar14,(long)acStack_78 + 1);
      }
      acStack_78[0] = (undefined1)lStack_40;
      acStack_78[1] = lStack_40._1_1_;
      acStack_78[2] = lStack_40._2_1_;
      acStack_78[3] = lStack_40._3_1_;
      acStack_78[4] = lStack_40._4_1_;
      acStack_78[5] = lStack_40._5_1_;
      acStack_78[6] = lStack_40._6_1_;
      acStack_78[7] = lStack_40._7_1_;
      local_70 = uVar10;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (__return_storage_ptr__,(address *)&stack0xffffffffffffff78);
      if (peVar6->failed_ != false) {
        return __return_storage_ptr__;
      }
      lVar11 = uVar4 - 1;
      pcVar9 = pcVar9 + uVar8 + 1;
    }
    else {
      pvVar3 = memchr(pcVar9,0x3a,__n_00);
      uVar4 = (long)pvVar3 - (long)pcVar9;
      if (uVar4 == 0xffffffffffffffff || pvVar3 == (void *)0x0) {
        eVar13 = errors::make_error_code(invalid_port);
        goto LAB_00302dd2;
      }
      uVar8 = uVar4 + 1;
      if (__n_00 <= uVar4) goto LAB_00302e6d;
      pcVar14 = acStack_78;
      local_68 = uVar8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff78,pcVar9,pcVar9 + uVar4);
      pcVar15 = pcVar14;
      piVar5 = __errno_location();
      *piVar5 = 0;
      iVar2 = inet_pton(2,pcVar14,&local_58);
      iVar1 = *piVar5;
      peVar6->val_ = iVar1;
      peVar6->failed_ = iVar1 != 0;
      peVar6->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                      super_error_category;
      if (iVar2 < 1 && iVar1 == 0) {
        peVar6->val_ = 0x16;
        peVar6->failed_ = true;
        *(undefined3 *)&peVar6->field_0x5 = 0;
        peVar6->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                        super_error_category;
      }
      if (pcVar15 != acStack_78) {
        operator_delete(pcVar15,(long)acStack_78 + 1);
      }
      acStack_78[0] = '\0';
      acStack_78[1] = '\0';
      acStack_78[2] = '\0';
      acStack_78[3] = '\0';
      acStack_78[4] = '\0';
      acStack_78[5] = '\0';
      acStack_78[6] = '\0';
      acStack_78[7] = '\0';
      local_70 = 0;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (__return_storage_ptr__,(address *)&stack0xffffffffffffff78);
      if (peVar6->failed_ != false) {
        return __return_storage_ptr__;
      }
      lVar11 = __n_00 - local_68;
      pcVar9 = pcVar9 + local_68;
    }
    if (lVar11 == 0) {
      eVar13 = errors::make_error_code(invalid_port);
    }
    else {
      pcVar14 = acStack_78;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff78,pcVar9,pcVar9 + lVar11);
      iVar1 = atoi(pcVar14);
      if (pcVar14 != acStack_78) {
        operator_delete(pcVar14,(long)acStack_78 + 1);
      }
      if (0xffff0000 < iVar1 - 0x10000U) {
        (__return_storage_ptr__->impl_).data_.v4.sin_port = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
        return __return_storage_ptr__;
      }
      eVar13 = errors::make_error_code(invalid_port);
    }
  }
LAB_00302dd2:
  *peVar6 = eVar13;
  return __return_storage_ptr__;
}

Assistant:

tcp::endpoint parse_endpoint(string_view str, error_code& ec)
	{
		tcp::endpoint ret;

		str = trim(str);

		string_view addr;
		string_view port;

		if (str.empty())
		{
			ec = errors::invalid_port;
			return ret;
		}

		// this is for IPv6 addresses
		if (str.front() == '[')
		{
			auto const close_bracket = str.find_first_of(']');
			if (close_bracket == string_view::npos)
			{
				ec = errors::expected_close_bracket_in_address;
				return ret;
			}
			addr = str.substr(1, close_bracket - 1);
			port = str.substr(close_bracket + 1);
			if (port.empty() || port.front() != ':')
			{
				ec = errors::invalid_port;
				return ret;
			}
			// shave off the ':'
			port = port.substr(1);
			ret.address(make_address_v6(addr, ec));
			if (ec) return ret;
		}
		else
		{
			auto const port_pos = str.find_first_of(':');
			if (port_pos == string_view::npos)
			{
				ec = errors::invalid_port;
				return ret;
			}
			addr = str.substr(0, port_pos);
			port = str.substr(port_pos + 1);
			ret.address(make_address_v4(addr, ec));
			if (ec) return ret;
		}

		if (port.empty())
		{
			ec = errors::invalid_port;
			return ret;
		}

		int const port_num = std::atoi(std::string(port).c_str());
		if (port_num <= 0 || port_num > std::numeric_limits<std::uint16_t>::max())
		{
			ec = errors::invalid_port;
			return ret;
		}
		ret.port(static_cast<std::uint16_t>(port_num));
		return ret;
	}